

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void __thiscall CP::queue<int>::queue(queue<int> *this,queue<int> *a)

{
  ulong uVar1;
  size_t sVar2;
  int *piVar3;
  int *__s;
  size_t sVar4;
  ulong __n;
  
  uVar1 = a->mCap;
  __n = -(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4;
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  this->mData = __s;
  this->mCap = uVar1;
  this->mSize = a->mSize;
  sVar2 = a->mCap;
  if (sVar2 != 0) {
    piVar3 = a->mData;
    sVar4 = 0;
    do {
      __s[sVar4] = piVar3[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  this->mFront = a->mFront;
  return;
}

Assistant:

queue(const queue<T>& a) {
      this->mData = new T[a.mCap]();
      this->mCap = a.mCap;
      this->mSize = a.mSize;
      for (size_t i = 0; i < a.mCap;i++) {
        mData[i] = a.mData[i];
      }
      this->mFront = a.mFront;
    }